

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

void __thiscall
amrex::Amr::InitializeInit
          (Amr *this,Real strt_time,Real param_2,BoxArray *lev0_grids,
          Vector<int,_std::allocator<int>_> *pmap)

{
  Vector<int,_std::allocator<int>_> *extraout_RDX;
  Vector<int,_std::allocator<int>_> *extraout_RDX_00;
  int linit;
  int local_14;
  
  if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.check_input == true) {
    checkInput(this);
    pmap = extraout_RDX;
  }
  *(undefined4 *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c = 0;
  if ((this->probin_file)._M_string_length != 0) {
    local_14 = 1;
    readProbinFile(this,&local_14);
    pmap = extraout_RDX_00;
  }
  this->cumtime = strt_time;
  defBaseLevel(this,strt_time,lev0_grids,pmap);
  return;
}

Assistant:

void
Amr::InitializeInit(Real              strt_time,
                    Real              /*stop_time*/,
                    const BoxArray*   lev0_grids,
                    const Vector<int>* pmap)
{
    BL_PROFILE("Amr::InitializeInit()");
    BL_COMM_PROFILE_NAMETAG("Amr::InitializeInit TOP");
    if (check_input) checkInput();
    //
    // Generate internal values from user-supplied values.
    //
    finest_level = 0;
    //
    // Init problem dependent data.
    //

#ifndef AMREX_NO_PROBINIT
    if (!probin_file.empty()) {
        int linit = true;
        readProbinFile(linit);
    }
#endif

    cumtime = strt_time;
    //
    // Define base level grids.  Note that if we are restarting from a plotfile, this
    //    routine will call the level 0 AmrLevel initialization which will overwrite cumtime.
    //
    defBaseLevel(strt_time, lev0_grids, pmap);
}